

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueStore.cpp
# Opt level: O1

void __thiscall xercesc_4_0::ValueStore::startValueScope(ValueStore *this)

{
  RefVectorOf<xercesc_4_0::IC_Field> *pRVar1;
  BaseRefVectorOf<xercesc_4_0::IC_Field> *this_00;
  IC_Field *key;
  XMLSize_t XVar2;
  XMLSize_t getAt;
  
  this->fValuesCount = 0;
  pRVar1 = this->fIdentityConstraint->fFields;
  if (pRVar1 == (RefVectorOf<xercesc_4_0::IC_Field> *)0x0) {
    XVar2 = 0;
  }
  else {
    XVar2 = (pRVar1->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fCurCount;
  }
  if (XVar2 != 0) {
    getAt = 0;
    do {
      this_00 = &this->fIdentityConstraint->fFields->super_BaseRefVectorOf<xercesc_4_0::IC_Field>;
      if (this_00 == (BaseRefVectorOf<xercesc_4_0::IC_Field> *)0x0) {
        key = (IC_Field *)0x0;
      }
      else {
        key = BaseRefVectorOf<xercesc_4_0::IC_Field>::elementAt(this_00,getAt);
      }
      FieldValueMap::put(&this->fValues,key,(DatatypeValidator *)0x0,(XMLCh *)0x0);
      getAt = getAt + 1;
    } while (XVar2 != getAt);
  }
  return;
}

Assistant:

void ValueStore::startValueScope() {

    fValuesCount = 0;

    XMLSize_t count = fIdentityConstraint->getFieldCount();

    for (XMLSize_t i = 0; i < count; i++) {
        fValues.put(fIdentityConstraint->getFieldAt(i), 0, 0);
    }
}